

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArchiverImpl.cpp
# Opt level: O3

IPipelineState * __thiscall
Diligent::ArchiverImpl::GetPipelineState(ArchiverImpl *this,PIPELINE_TYPE PSOType,char *PSOName)

{
  int iVar1;
  iterator iVar2;
  IPipelineState *pIVar3;
  string msg;
  undefined1 local_40 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_30;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->m_PipelinesMtx);
  if (iVar1 != 0) {
    std::__throw_system_error(iVar1);
  }
  if (PSOType < PIPELINE_TYPE_COUNT) {
    local_40._0_4_ = *(undefined4 *)(&DAT_007eded8 + (ulong)PSOType * 4);
    HashMapStringKey::HashMapStringKey((HashMapStringKey *)(local_40 + 8),PSOName,false);
    iVar2 = std::
            _Hashtable<Diligent::DeviceObjectArchive::NamedResourceKey,_std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::RefCntAutoPtr<Diligent::SerializedPipelineStateImpl>_>,_std::allocator<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::RefCntAutoPtr<Diligent::SerializedPipelineStateImpl>_>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::DeviceObjectArchive::NamedResourceKey>,_Diligent::DeviceObjectArchive::NamedResourceKey::Hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&(this->m_Pipelines)._M_h,(key_type *)local_40);
    if (((Char *)local_40._8_8_ != (Char *)0x0) && ((long)local_30._M_allocated_capacity < 0)) {
      operator_delete__((void *)local_40._8_8_);
    }
    if (iVar2.
        super__Node_iterator_base<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::RefCntAutoPtr<Diligent::SerializedPipelineStateImpl>_>,_false>
        ._M_cur != (__node_type *)0x0) {
      pIVar3 = *(IPipelineState **)
                ((long)iVar2.
                       super__Node_iterator_base<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::RefCntAutoPtr<Diligent::SerializedPipelineStateImpl>_>,_false>
                       ._M_cur + 0x20);
      goto LAB_001b6a70;
    }
  }
  else {
    FormatString<char[25]>((string *)local_40,(char (*) [25])"Unexpected pipeline type");
    DebugAssertionFailed
              ((Char *)CONCAT44(local_40._4_4_,local_40._0_4_),"GetPipelineState",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/Archiver/src/ArchiverImpl.cpp"
               ,0x1a2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_40._4_4_,local_40._0_4_) != &local_30) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT44(local_40._4_4_,local_40._0_4_),local_30._M_allocated_capacity + 1)
      ;
    }
  }
  pIVar3 = (IPipelineState *)0x0;
LAB_001b6a70:
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_PipelinesMtx);
  return pIVar3;
}

Assistant:

IPipelineState* ArchiverImpl::GetPipelineState(PIPELINE_TYPE PSOType,
                                               const char*   PSOName)
{
    std::lock_guard<std::mutex> Guard{m_PipelinesMtx};

    const auto ResType = PiplineTypeToArchiveResourceType(PSOType);
    if (ResType == ResourceType::Undefined)
    {
        UNEXPECTED("Unexpected pipeline type");
        return nullptr;
    }

    auto it = m_Pipelines.find(NamedResourceKey{ResType, PSOName});
    return it != m_Pipelines.end() ? it->second.RawPtr() : nullptr;
}